

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenConstSetValueI64High(BinaryenExpressionRef expr,int32_t valueHigh)

{
  int64_t iVar1;
  bool bVar2;
  int64_t init;
  int64_t local_68;
  Literal local_50;
  BasicType local_34;
  int64_t local_30;
  int64_t valueI64;
  Literal *value;
  Expression *expression;
  BinaryenExpressionRef pEStack_10;
  int32_t valueHigh_local;
  BinaryenExpressionRef expr_local;
  
  value = (Literal *)expr;
  expression._4_4_ = valueHigh;
  pEStack_10 = expr;
  bVar2 = wasm::Expression::is<wasm::Const>(expr);
  if (!bVar2) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xadf,"void BinaryenConstSetValueI64High(BinaryenExpressionRef, int32_t)");
  }
  valueI64 = (int64_t)&value->type;
  local_34 = i64;
  bVar2 = wasm::Type::operator==((Type *)&value[1].field_0.func.super_IString.str._M_str,&local_34);
  if (bVar2) {
    local_68 = wasm::Literal::geti64((Literal *)valueI64);
  }
  else {
    local_68 = 0;
  }
  local_30 = local_68;
  iVar1 = local_30;
  local_30._0_4_ = (undefined4)local_68;
  init = CONCAT44(expression._4_4_,(undefined4)local_30);
  local_30 = iVar1;
  wasm::Literal::Literal(&local_50,init);
  wasm::Literal::operator=((Literal *)&value->type,&local_50);
  wasm::Literal::~Literal(&local_50);
  return;
}

Assistant:

void BinaryenConstSetValueI64High(BinaryenExpressionRef expr,
                                  int32_t valueHigh) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  auto& value = static_cast<Const*>(expression)->value;
  int64_t valueI64 = value.type == Type::i64 ? value.geti64() : 0;
  static_cast<Const*>(expression)->value =
    Literal((int64_t(valueHigh) << 32) | (valueI64 & 0xffffffff));
}